

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.hh
# Opt level: O0

size_t __thiscall
tchecker::
cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
::collect(cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
          *this)

{
  iterator_t iVar1;
  bool bVar2;
  int iVar3;
  reference this_00;
  make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL> *this_01;
  undefined4 extraout_var;
  size_t sVar4;
  _Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true>
  local_28;
  _Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true>
  local_20;
  iterator_t it;
  size_t previous_size;
  cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  *this_local;
  
  it.
  super__Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true>
  ._M_cur = (_Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true>
             )hashtable_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
              ::size(&this->_hashtable);
  local_20._M_cur =
       (__node_type *)
       hashtable_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
       ::begin(&this->_hashtable);
  while( true ) {
    local_28._M_cur =
         (__node_type *)
         hashtable_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
         ::end(&this->_hashtable);
    bVar2 = std::__detail::operator!=(&local_20,&local_28);
    iVar1 = it;
    if (!bVar2) break;
    this_00 = std::__detail::
              _Node_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true,_true>
              ::operator*((_Node_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true,_true>
                           *)&local_20);
    this_01 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
              ::operator->(this_00);
    sVar4 = make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>::refcount(this_01);
    if (sVar4 == 1) {
      iVar3 = hashtable_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
              ::remove(&this->_hashtable,(char *)&local_20);
      local_20._M_cur = (__node_type *)CONCAT44(extraout_var,iVar3);
    }
    else {
      std::__detail::
      _Node_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true,_true>
      ::operator++((_Node_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true,_true>
                    *)&local_20);
    }
  }
  sVar4 = hashtable_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
          ::size(&this->_hashtable);
  return (long)iVar1.
               super__Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true>
               ._M_cur - sVar4;
}

Assistant:

virtual std::size_t collect()
  {
    std::size_t const previous_size = _hashtable.size();
    typename tchecker::hashtable_t<SPTR, HASH, EQUAL>::iterator_t it = _hashtable.begin();
    while (it != _hashtable.end()) {
      if ((*it)->refcount() == 1)
        it = _hashtable.remove(it);
      else
        ++it;
    }
    return previous_size - _hashtable.size();
  }